

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZukerAlgorithm.cpp
# Opt level: O1

int __thiscall ZukerAlgorithm::calculate_W(ZukerAlgorithm *this)

{
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long local_40;
  
  calculate_V(this);
  iVar4 = this->n;
  if (1 < iVar4) {
    uVar11 = 1;
    local_40 = 4;
    uVar10 = 0xfffffffe;
    do {
      piVar7 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = basepair(*piVar7,piVar7[uVar11]);
      iVar4 = 10000000;
      iVar5 = 0;
      if (bVar3) {
        piVar7 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = AU[*piVar7][piVar7[uVar11]] +
                (this->V).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        iVar4 = iVar5;
        if (9999999 < iVar5) {
          iVar4 = 10000000;
        }
        iVar5 = -(uint)(iVar5 < 10000000);
      }
      piVar1 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar1[uVar11 - 1] < iVar4) {
        iVar5 = -2;
        iVar4 = piVar1[uVar11 - 1];
      }
      iVar9 = iVar4;
      if (4 < uVar11) {
        piVar2 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (int *)(local_40 + (long)this->n * 4 +
                        (long)(this->V).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        lVar6 = 0;
        do {
          iVar8 = *piVar7 + piVar1[lVar6] + AU[piVar2[lVar6 + 1]][piVar2[uVar11]];
          if (iVar9 <= iVar8) {
            iVar8 = iVar9;
          }
          iVar9 = iVar8;
          lVar6 = lVar6 + 1;
          piVar7 = piVar7 + this->n;
        } while (uVar10 - 1 != lVar6);
      }
      if (iVar9 < iVar4) {
        iVar5 = -4;
      }
      piVar1[uVar11] = iVar9;
      (this->WB).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = iVar5;
      uVar11 = uVar11 + 1;
      iVar4 = this->n;
      uVar10 = (ulong)((int)uVar10 + 1);
      local_40 = local_40 + 4;
    } while ((long)uVar11 < (long)iVar4);
  }
  return (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[(long)iVar4 + -1];
}

Assistant:

int ZukerAlgorithm::calculate_W() {
    int min_w = inf, energy = inf, t = 0;

    calculate_V();
    int i = 0;
    for (int j = 1; j < n; ++j) {
        min_w = inf, energy = inf, t = 0;
        if (basepair(seq[i],seq[j])) {
            min_w = min(min_w, V[index(i,j)] + AU[seq[i]][seq[j]]);
            if (energy > min_w) {
                energy = min_w;
                t = -1;
            }
        }
//        de << 1 << " " << min_w << endl;

        min_w = min(min_w, W[index(i,j-1)]);
        if (energy > min_w) {
            energy = min_w;
            t = -2;
        }
//        de << 2 << " " << min_w << endl;

        for (int k = 1; k <= j-4; ++k) {
            min_w = min(min_w, W[index(i,k-1)] + V[index(k,j)] + AU[seq[k]][seq[j]]);
        }
        if (energy > min_w) {
            energy = min_w;
            t = -4;
        }
//        de << 3 << " " << min_w << endl;

        W[index(i,j)] = min_w;
        WB[index(i,j)] = t;
//        de << "Z - l: " << i << ",r: " << j << ",L: " << seq[i] << ",R: " << seq[j] << ",ret: " << min_w  << endl;
    }


    return W[index(0,n-1)];
}